

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImStb::stb_textedit_clamp(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = str->CurLenW;
  iVar2 = state->select_start;
  iVar3 = state->select_end;
  if (iVar2 != iVar3) {
    if (iVar1 < iVar2) {
      state->select_start = iVar1;
      iVar2 = iVar1;
    }
    if (iVar1 < iVar3) {
      state->select_end = iVar1;
      iVar3 = iVar1;
    }
    if (iVar2 == iVar3) {
      state->cursor = iVar2;
    }
  }
  if (iVar1 < state->cursor) {
    state->cursor = iVar1;
  }
  return;
}

Assistant:

static int     STB_TEXTEDIT_STRINGLEN(const ImGuiInputTextState* obj)                             { return obj->CurLenW; }